

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CClass *stm)

{
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
  *this_00;
  pointer pCVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  element_type *peVar5;
  pointer pCVar6;
  pointer pCVar7;
  shared_ptr<ClassInfo> *this_01;
  shared_ptr<ClassInfo> local_e8;
  CError local_d8;
  TypeInfo local_a8;
  CError local_80;
  shared_ptr<ClassInfo> local_40;
  shared_ptr<ClassInfo> local_30;
  byte local_19;
  CClass *pCStack_18;
  bool isBadInherited;
  CClass *stm_local;
  CTypeCheckerVisitor *this_local;
  
  pCStack_18 = stm;
  stm_local = (CClass *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: class\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pCStack_18->id);
  if (((bVar1) &&
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pCStack_18->fields), bVar1)) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pCStack_18->methods), bVar1)) {
    this_00 = &std::__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->table)->classes;
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&pCStack_18->id);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
             ::operator[](this_00,&pCVar2->name);
    this_01 = &this->currentClass;
    std::shared_ptr<ClassInfo>::operator=(this_01,pmVar3);
    std::operator<<((ostream *)&std::cout,"Before cyclic check\n");
    std::shared_ptr<ClassInfo>::shared_ptr(&local_30,this_01);
    std::shared_ptr<ClassInfo>::shared_ptr(&local_40,this_01);
    bVar1 = checkCyclicInheritance(this,&local_30,&local_40);
    std::shared_ptr<ClassInfo>::~shared_ptr(&local_40);
    std::shared_ptr<ClassInfo>::~shared_ptr(&local_30);
    local_19 = bVar1;
    poVar4 = std::operator<<((ostream *)&std::cout,"Cyclic inheritance was checked for class: ");
    peVar5 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->currentClass);
    poVar4 = std::operator<<(poVar4,(string *)peVar5);
    std::operator<<(poVar4,"\n");
    if ((local_19 & 1) != 0) {
      pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                         (&pCStack_18->parentClass);
      CError::CError(&local_80,(string *)CError::CYCLIC_INHERITANCE_abi_cxx11_,
                     &(pCVar2->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_80);
      CError::~CError(&local_80);
      return;
    }
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&pCStack_18->id);
    (**(pCVar2->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
    pCVar6 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::operator->
                       (&pCStack_18->fields);
    (**(pCVar6->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar6,this);
    pCVar7 = std::unique_ptr<CMethodList,_std::default_delete<CMethodList>_>::operator->
                       (&pCStack_18->methods);
    (**(pCVar7->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar7,this);
    TypeInfo::TypeInfo(&local_a8,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,&local_a8);
    TypeInfo::~TypeInfo(&local_a8);
  }
  else {
    CError::CError(&local_d8,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(pCStack_18->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_d8);
    CError::~CError(&local_d8);
  }
  std::shared_ptr<ClassInfo>::shared_ptr(&local_e8,(nullptr_t)0x0);
  std::shared_ptr<ClassInfo>::operator=(&this->currentClass,&local_e8);
  std::shared_ptr<ClassInfo>::~shared_ptr(&local_e8);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CClass &stm ) 
{
	std::cout << "typechecker: class\n";
    if( stm.id && stm.fields && stm.methods ) {
        currentClass = table->classes[stm.id->name];
        std::cout << "Before cyclic check\n";
        bool isBadInherited = checkCyclicInheritance( currentClass, currentClass );
        std::cout << "Cyclic inheritance was checked for class: " << currentClass->name << "\n";
        if( isBadInherited ) {
            errors.push_back( CError( CError::CYCLIC_INHERITANCE, stm.parentClass->position ) );
            return;
        }
        stm.id->Accept( *this );
        stm.fields->Accept( *this );
        stm.methods->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentClass = nullptr;
}